

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O0

QList<QNetworkProxy> * __thiscall
QGlobalNetworkProxy::proxyForQuery(QGlobalNetworkProxy *this,QNetworkProxyQuery *query)

{
  undefined8 uVar1;
  bool bVar2;
  byte bVar3;
  ProxyType PVar4;
  undefined8 in_RDX;
  QMessageLogger *in_RSI;
  QList<QNetworkProxy> *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar5;
  QList<QNetworkProxy> *result;
  QString hostname;
  QHostAddress parsed;
  QMutexLocker<QRecursiveMutex> locker;
  undefined4 in_stack_fffffffffffffdb8;
  ComponentFormattingOption in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  uint in_stack_fffffffffffffdc4;
  QList<QNetworkProxy> *pQVar6;
  quint16 port;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffde4;
  undefined1 in_stack_fffffffffffffde8 [16];
  undefined1 auVar8 [12];
  char local_198 [32];
  undefined1 local_178 [288];
  QLatin1StringView local_58;
  QUrl local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  auVar8 = in_stack_fffffffffffffde8._4_12_;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  pQVar6 = in_RDI;
  QMutexLocker<QRecursiveMutex>::QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             (QRecursiveMutex *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  (pQVar6->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (pQVar6->d).ptr = (QNetworkProxy *)0xaaaaaaaaaaaaaaaa;
  (pQVar6->d).size = -0x5555555555555556;
  QList<QNetworkProxy>::QList((QList<QNetworkProxy> *)0x249e0c);
  port = (quint16)((ulong)pQVar6 >> 0x30);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress
            ((QHostAddress *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  QNetworkProxyQuery::url((QNetworkProxyQuery *)in_RDI);
  QFlags<QUrl::ComponentFormattingOption>::QFlags
            ((QFlags<QUrl::ComponentFormattingOption> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdbc
            );
  QUrl::host((QFlags_conflict *)&local_38);
  QUrl::~QUrl(&local_40);
  local_58 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_RDI,CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0)
                       );
  bVar2 = ::operator==((QString *)in_RDI,
                       (QLatin1StringView *)
                       CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  uVar7 = CONCAT13(1,(int3)in_stack_fffffffffffffde0);
  if (!bVar2) {
    QVar5 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_RDI,CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0))
    ;
    bVar3 = QString::startsWith((QLatin1String *)&local_38,(CaseSensitivity)QVar5.m_size);
    auVar8 = QVar5._4_12_;
    uVar7 = CONCAT13(1,(int3)uVar7);
    if ((bVar3 & 1) == 0) {
      bVar2 = QHostAddress::setAddress
                        ((QHostAddress *)
                         CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                         (QString *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      in_stack_fffffffffffffdc4 = in_stack_fffffffffffffdc4 & 0xffffff;
      if (bVar2) {
        bVar2 = QHostAddress::isLoopback((QHostAddress *)0x249f5e);
        in_stack_fffffffffffffdc4 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffdc4);
      }
      uVar7 = CONCAT13((char)(in_stack_fffffffffffffdc4 >> 0x18),(int3)uVar7);
    }
  }
  if ((char)((uint)uVar7 >> 0x18) == '\0') {
    if (*(char16_t **)(in_RSI + 1) == (char16_t *)0x0) {
      if (((in_RSI->context).category == (char *)0x0) ||
         (PVar4 = QNetworkProxy::type((QNetworkProxy *)
                                      CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0))
         , PVar4 == DefaultProxy)) {
        if ((*(byte *)((long)(in_RSI + 1) + 0x18) & 1) == 0) {
          QString::QString((QString *)0x24a154);
          QString::QString((QString *)0x24a161);
          QString::QString((QString *)0x24a16e);
          QNetworkProxy::QNetworkProxy
                    (auVar8._4_8_,auVar8._0_4_,(QString *)CONCAT44(in_stack_fffffffffffffde4,uVar7),
                     port,(QString *)in_RSI,(QString *)in_RDI);
          QList<QNetworkProxy>::operator<<
                    ((QList<QNetworkProxy> *)
                     CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     (rvalue_ref)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x24a1b9);
          QString::~QString((QString *)0x24a1c6);
          QString::~QString((QString *)0x24a1d3);
          QString::~QString((QString *)0x24a1e0);
        }
        else {
          QNetworkProxyFactory::systemProxyForQuery
                    ((QNetworkProxyQuery *)CONCAT44(in_stack_fffffffffffffde4,uVar7));
          QList<QNetworkProxy>::operator=
                    ((QList<QNetworkProxy> *)
                     CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     (QList<QNetworkProxy> *)
                     CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          QList<QNetworkProxy>::~QList((QList<QNetworkProxy> *)0x24a0a9);
          QString::QString((QString *)0x24a0b6);
          QString::QString((QString *)0x24a0c3);
          QString::QString((QString *)0x24a0d0);
          QNetworkProxy::QNetworkProxy
                    (auVar8._4_8_,auVar8._0_4_,(QString *)CONCAT44(in_stack_fffffffffffffde4,uVar7),
                     port,(QString *)in_RSI,(QString *)in_RDI);
          QList<QNetworkProxy>::operator<<
                    ((QList<QNetworkProxy> *)
                     CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     (rvalue_ref)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x24a11b);
          QString::~QString((QString *)0x24a128);
          QString::~QString((QString *)0x24a135);
          QString::~QString((QString *)0x24a142);
        }
      }
      else {
        QList<QNetworkProxy>::operator<<
                  ((QList<QNetworkProxy> *)
                   CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                   (parameter_type)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      }
    }
    else {
      (**(code **)(*(long *)*(char16_t **)(in_RSI + 1) + 0x10))
                (local_178,*(char16_t **)(in_RSI + 1),in_RDX);
      QList<QNetworkProxy>::operator=
                ((QList<QNetworkProxy> *)
                 CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 (QList<QNetworkProxy> *)
                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      QList<QNetworkProxy>::~QList((QList<QNetworkProxy> *)0x24a22f);
      bVar2 = QList<QNetworkProxy>::isEmpty((QList<QNetworkProxy> *)0x24a239);
      if (bVar2) {
        QMessageLogger::QMessageLogger
                  (in_RSI,(char *)in_RDI,in_stack_fffffffffffffdc4,
                   (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        uVar1._0_4_ = in_RSI[1].context.version;
        uVar1._4_4_ = in_RSI[1].context.line;
        QMessageLogger::warning
                  (local_198,"QNetworkProxyFactory: factory %p has returned an empty result set",
                   uVar1);
        QString::QString((QString *)0x24a284);
        QString::QString((QString *)0x24a28e);
        QString::QString((QString *)0x24a298);
        QNetworkProxy::QNetworkProxy
                  (auVar8._4_8_,auVar8._0_4_,(QString *)CONCAT44(in_stack_fffffffffffffde4,uVar7),
                   port,(QString *)in_RSI,(QString *)in_RDI);
        QList<QNetworkProxy>::operator<<
                  ((QList<QNetworkProxy> *)
                   CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x24a2dd);
        QString::~QString((QString *)0x24a2e7);
        QString::~QString((QString *)0x24a2f1);
        QString::~QString((QString *)0x24a2fe);
      }
    }
  }
  else {
    QString::QString((QString *)0x249f84);
    QString::QString((QString *)0x249f91);
    QString::QString((QString *)0x249f9e);
    QNetworkProxy::QNetworkProxy
              (auVar8._4_8_,auVar8._0_4_,(QString *)CONCAT44(in_stack_fffffffffffffde4,uVar7),port,
               (QString *)in_RSI,(QString *)in_RDI);
    QList<QNetworkProxy>::operator<<
              ((QList<QNetworkProxy> *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0)
               ,(rvalue_ref)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x249fe9);
    QString::~QString((QString *)0x249ff6);
    QString::~QString((QString *)0x24a003);
    QString::~QString((QString *)0x24a010);
  }
  QString::~QString((QString *)0x24a318);
  QHostAddress::~QHostAddress((QHostAddress *)0x24a325);
  QMutexLocker<QRecursiveMutex>::~QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QNetworkProxy> QGlobalNetworkProxy::proxyForQuery(const QNetworkProxyQuery &query)
{
    QMutexLocker locker(&mutex);

    QList<QNetworkProxy> result;

    // don't look for proxies for a local connection
    QHostAddress parsed;
    QString hostname = query.url().host();
    if (hostname == "localhost"_L1 || hostname.startsWith("localhost."_L1)
            || (parsed.setAddress(hostname) && (parsed.isLoopback()))) {
        result << QNetworkProxy(QNetworkProxy::NoProxy);
        return result;
    }

    if (!applicationLevelProxyFactory) {
        if (applicationLevelProxy
            && applicationLevelProxy->type() != QNetworkProxy::DefaultProxy) {
            result << *applicationLevelProxy;
        } else if (useSystemProxies) {
            result = QNetworkProxyFactory::systemProxyForQuery(query);

            // Make sure NoProxy is in the list, so that QTcpServer can work:
            // it searches for the first proxy that can has the ListeningCapability capability
            // if none have (as is the case with HTTP proxies), it fails to bind.
            // NoProxy allows it to fallback to the 'no proxy' case and bind.
            result << QNetworkProxy(QNetworkProxy::NoProxy);
        } else {
            result << QNetworkProxy(QNetworkProxy::NoProxy);
        }
        return result;
    }

    // we have a factory
    result = applicationLevelProxyFactory->queryProxy(query);
    if (result.isEmpty()) {
        qWarning("QNetworkProxyFactory: factory %p has returned an empty result set",
                 applicationLevelProxyFactory);
        result << QNetworkProxy(QNetworkProxy::NoProxy);
    }
    return result;
}